

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O2

mz_ulong buminiz::mz_compressBound(mz_ulong source_len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (source_len * 0x6e) / 100 + 0x80;
  uVar1 = (source_len / 0x7c00) * 5 + source_len + 0x85;
  if (uVar2 <= uVar1) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

mz_ulong mz_deflateBound(mz_streamp pStream, mz_ulong source_len)
{
  (void)pStream;
  // This is really over conservative. (And lame, but it's actually pretty tricky to compute a true upper bound given the way tdefl's blocking works.)
  mz_uint64 a = 128ULL + (source_len * 110ULL) / 100ULL;
  mz_uint64 b = 128ULL + (mz_uint64)source_len + ((source_len / (31 * 1024)) + 1ULL) * 5ULL;
  
  mz_uint64 t = MZ_MAX(a, b);
  if (((mz_ulong)t) != t)
     t = (mz_ulong)(-1);

  return (mz_ulong)t;
}